

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O3

void set_hduname(int hdunum,int hdutype,char *extname,int extver)

{
  HduName *pHVar1;
  HduName **ppHVar2;
  char *__dest;
  
  ppHVar2 = hduname;
  pHVar1 = hduname[(long)hdunum + -1];
  pHVar1->hdutype = hdutype;
  __dest = pHVar1->extname;
  if (extname == (char *)0x0) {
    *__dest = '\0';
  }
  else {
    strcpy(__dest,extname);
  }
  ppHVar2[(long)hdunum + -1]->extver = extver;
  return;
}

Assistant:

void set_hduname(  int hdunum,		/* hdu number */ 
		   int hdutype,		/* hdutype */
		   char* extname,	/* extension name */
                   int  extver 		/* extension version */
                )
{
    int i; 
    i = hdunum - 1;
    hduname[i]->hdutype = hdutype;
    if(extname!=NULL)
        strcpy (hduname[i]->extname,extname); 
    else 
        strcpy(hduname[i]->extname,"");
    hduname[i]->extver = extver;
    return;
}